

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigSavePattern(Ivy_FraigMan_t *p)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  uint i;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  for (i = 0; p_00 = p->pManFraig->vPis, (int)i < p_00->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p_00,i);
    if (p->pSat->model[*(int *)((long)pvVar1 + 0x28)] == 1) {
      p->pPatWords[i >> 5] = p->pPatWords[i >> 5] | 1 << ((byte)i & 0x1f);
    }
  }
  return;
}

Assistant:

void Ivy_FraigSavePattern( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Ivy_ManForEachPi( p->pManFraig, pObj, i )
//    Vec_PtrForEachEntry( Ivy_Obj_t *, p->vPiVars, pObj, i )
//        if ( p->pSat->model.ptr[Ivy_ObjSatNum(pObj)] == l_True )
        if ( p->pSat->model[Ivy_ObjSatNum(pObj)] == l_True )
            Ivy_InfoSetBit( p->pPatWords, i );
//            Ivy_InfoSetBit( p->pPatWords, pObj->Id - 1 );
}